

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp3_qpack.c
# Opt level: O3

nghttp3_ssize
nghttp3_qpack_decoder_read_encoder(nghttp3_qpack_decoder *decoder,uint8_t *src,size_t srclen)

{
  uint64_t *puVar1;
  nghttp3_rcbuf **rcbuf_ptr;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  uint8_t *puVar6;
  size_t sVar7;
  nghttp3_rcbuf **rcbuf_ptr_00;
  ulong n;
  byte *end;
  nghttp3_ssize nVar8;
  int rfin;
  int local_74;
  nghttp3_buf *local_70;
  nghttp3_buf *local_68;
  nghttp3_qpack_read_state *local_60;
  uint8_t *local_58;
  nghttp3_rcbuf **local_50;
  nghttp3_mem *local_48;
  size_t local_40;
  byte *local_38;
  
  nVar8 = -0x6c;
  if ((decoder->ctx).bad == '\0') {
    if (srclen == 0) {
      nVar8 = 0;
    }
    else {
      local_48 = (decoder->ctx).mem;
      uVar5 = decoder->uninterrupted_encoderlen + srclen;
      decoder->uninterrupted_encoderlen = uVar5;
      nVar8 = -0x192;
      if (uVar5 < 0x20001) {
        end = src + srclen;
        puVar1 = &(decoder->rstate).left;
        local_68 = &(decoder->rstate).valuebuf;
        rcbuf_ptr_00 = &(decoder->rstate).value;
        rcbuf_ptr = &(decoder->rstate).name;
        local_70 = &(decoder->rstate).namebuf;
        local_60 = &decoder->rstate;
        local_58 = src;
        local_50 = rcbuf_ptr_00;
        local_40 = srclen;
        local_38 = end;
LAB_00108cf4:
        switch(decoder->state) {
        case NGHTTP3_QPACK_ES_STATE_OPCODE:
          nVar8 = (*(code *)(&DAT_00114bd8 + *(int *)(&DAT_00114bd8 + (ulong)(*src >> 5) * 4)))();
          return nVar8;
        case NGHTTP3_QPACK_ES_STATE_READ_INDEX:
          nVar8 = qpack_read_varint(&local_74,local_60,src,end);
          if (nVar8 < 0) {
            n = 0xfffffe6e;
            if (nVar8 != -0x6c) {
              __assert_fail("NGHTTP3_ERR_QPACK_FATAL == nread",
                            "/workspace/llm4binary/github/license_c_cmakelists/ngtcp2[P]nghttp3/lib/nghttp3_qpack.c"
                            ,0xb2e,
                            "nghttp3_ssize nghttp3_qpack_decoder_read_encoder(nghttp3_qpack_decoder *, const uint8_t *, size_t)"
                           );
            }
            break;
          }
          src = src + nVar8;
          if (local_74 == 0) goto LAB_0010928d;
          if (decoder->opcode == NGHTTP3_QPACK_ES_OPCODE_SET_DTABLE_CAP) {
            iVar3 = nghttp3_qpack_decoder_set_max_dtable_capacity(decoder,(decoder->rstate).left);
            if (iVar3 == 0) {
              decoder->state = NGHTTP3_QPACK_ES_STATE_OPCODE;
              *rcbuf_ptr = (nghttp3_rcbuf *)0x0;
              (decoder->rstate).value = (nghttp3_rcbuf *)0x0;
              nghttp3_buf_init(local_70);
              nghttp3_buf_init(local_68);
              *(undefined8 *)((long)&(decoder->rstate).absidx + 4) = 0;
              (decoder->rstate).dynamic = 0;
              (decoder->rstate).huffman_encoded = 0;
              (decoder->rstate).shift = 0;
              (decoder->rstate).absidx = 0;
              *puVar1 = 0;
              (decoder->rstate).prefix = 0;
              goto switchD_00108d0f_default;
            }
            n = 0xfffffe6e;
            break;
          }
          uVar4 = nghttp3_qpack_decoder_rel2abs(decoder,local_60);
          if (-1 < (int)uVar4) {
            if (decoder->opcode == NGHTTP3_QPACK_ES_OPCODE_INSERT_INDEXED) {
              (decoder->rstate).prefix = 7;
              decoder->state = NGHTTP3_QPACK_ES_STATE_CHECK_VALUE_HUFFMAN;
              goto LAB_00109169;
            }
            if (decoder->opcode != NGHTTP3_QPACK_ES_OPCODE_DUPLICATE) {
              nghttp3_unreachable_fail("nghttp3_qpack.c",0xb5e,"nghttp3_qpack_decoder_read_encoder")
              ;
            }
            uVar4 = nghttp3_qpack_decoder_dtable_duplicate_add(decoder);
            if (uVar4 != 0) goto LAB_00109297;
            goto LAB_001090fe;
          }
          goto LAB_00109297;
        case NGHTTP3_QPACK_ES_STATE_CHECK_NAME_HUFFMAN:
          (decoder->rstate).huffman_encoded =
               (uint)((*src >> ((uint)(decoder->rstate).prefix & 0x1f) & 1) != 0);
          decoder->state = NGHTTP3_QPACK_ES_STATE_READ_NAMELEN;
          (decoder->rstate).left = 0;
          (decoder->rstate).shift = 0;
        case NGHTTP3_QPACK_ES_STATE_READ_NAMELEN:
          nVar8 = qpack_read_varint(&local_74,local_60,src,end);
          if (nVar8 < 0) {
            n = 0xfffffe6e;
            if (nVar8 != -0x6c) {
              __assert_fail("NGHTTP3_ERR_QPACK_FATAL == nread",
                            "/workspace/llm4binary/github/license_c_cmakelists/ngtcp2[P]nghttp3/lib/nghttp3_qpack.c"
                            ,0xb6b,
                            "nghttp3_ssize nghttp3_qpack_decoder_read_encoder(nghttp3_qpack_decoder *, const uint8_t *, size_t)"
                           );
            }
            break;
          }
          src = src + nVar8;
          if (local_74 == 0) {
LAB_0010928d:
            return (long)src - (long)local_58;
          }
          uVar5 = *puVar1;
          if (0x100 < uVar5) {
LAB_0010929e:
            n = 0xffffff93;
            break;
          }
          if ((decoder->rstate).huffman_encoded == 0) {
            decoder->state = NGHTTP3_QPACK_ES_STATE_READ_NAME;
          }
          else {
            decoder->state = NGHTTP3_QPACK_ES_STATE_READ_NAME_HUFFMAN;
            nghttp3_qpack_huffman_decode_context_init(&local_60->huffman_ctx);
            uVar5 = (decoder->rstate).left * 2;
          }
          uVar4 = nghttp3_rcbuf_new(rcbuf_ptr,uVar5 + 1,local_48);
          if (uVar4 != 0) {
LAB_00109297:
            n = (ulong)uVar4;
            break;
          }
          nghttp3_buf_wrap_init(local_70,(*rcbuf_ptr)->base,(*rcbuf_ptr)->len);
LAB_00109169:
          bVar2 = false;
          rcbuf_ptr_00 = local_50;
LAB_0010926d:
          if (src == end && !bVar2) {
            return local_40;
          }
          goto LAB_00108cf4;
        case NGHTTP3_QPACK_ES_STATE_READ_NAME_HUFFMAN:
          nVar8 = qpack_read_huffman_string(local_60,local_70,src,end);
          if (-1 < nVar8) {
            src = src + nVar8;
            if (*puVar1 != 0) goto LAB_0010928d;
            *(decoder->rstate).namebuf.last = '\0';
            sVar7 = nghttp3_buf_len(local_70);
            ((decoder->rstate).name)->len = sVar7;
            decoder->state = NGHTTP3_QPACK_ES_STATE_CHECK_VALUE_HUFFMAN;
            (decoder->rstate).prefix = 7;
            goto switchD_00108d0f_default;
          }
          n = 0xfffffe6e;
          if (nVar8 != -0x6c) {
            __assert_fail("NGHTTP3_ERR_QPACK_FATAL == nread",
                          "/workspace/llm4binary/github/license_c_cmakelists/ngtcp2[P]nghttp3/lib/nghttp3_qpack.c"
                          ,0xb91,
                          "nghttp3_ssize nghttp3_qpack_decoder_read_encoder(nghttp3_qpack_decoder *, const uint8_t *, size_t)"
                         );
          }
          break;
        case NGHTTP3_QPACK_ES_STATE_READ_NAME:
          uVar5 = (decoder->rstate).left;
          n = (long)end - (long)src;
          if (uVar5 <= (ulong)((long)end - (long)src)) {
            n = uVar5;
          }
          puVar6 = nghttp3_cpymem((decoder->rstate).namebuf.last,src,n);
          (decoder->rstate).namebuf.last = puVar6;
          sVar7 = (decoder->rstate).left;
          (decoder->rstate).left = sVar7 - n;
          if ((long)n < 0) break;
          src = src + n;
          if (sVar7 != n) goto LAB_0010928d;
          *puVar6 = '\0';
          sVar7 = nghttp3_buf_len(local_70);
          ((decoder->rstate).name)->len = sVar7;
          decoder->state = NGHTTP3_QPACK_ES_STATE_CHECK_VALUE_HUFFMAN;
          (decoder->rstate).prefix = 7;
          goto LAB_00109169;
        case NGHTTP3_QPACK_ES_STATE_CHECK_VALUE_HUFFMAN:
          (decoder->rstate).huffman_encoded =
               (uint)((*src >> ((uint)(decoder->rstate).prefix & 0x1f) & 1) != 0);
          decoder->state = NGHTTP3_QPACK_ES_STATE_READ_VALUELEN;
          (decoder->rstate).left = 0;
          (decoder->rstate).shift = 0;
        case NGHTTP3_QPACK_ES_STATE_READ_VALUELEN:
          nVar8 = qpack_read_varint(&local_74,local_60,src,end);
          if (nVar8 < 0) {
            n = 0xfffffe6e;
            if (nVar8 != -0x6c) {
              __assert_fail("NGHTTP3_ERR_QPACK_FATAL == nread",
                            "/workspace/llm4binary/github/license_c_cmakelists/ngtcp2[P]nghttp3/lib/nghttp3_qpack.c"
                            ,0xbbd,
                            "nghttp3_ssize nghttp3_qpack_decoder_read_encoder(nghttp3_qpack_decoder *, const uint8_t *, size_t)"
                           );
            }
            break;
          }
          src = src + nVar8;
          if (local_74 == 0) goto LAB_0010928d;
          uVar5 = *puVar1;
          if (0x10000 < uVar5) goto LAB_0010929e;
          if ((decoder->rstate).huffman_encoded == 0) {
            decoder->state = NGHTTP3_QPACK_ES_STATE_READ_VALUE;
          }
          else {
            decoder->state = NGHTTP3_QPACK_ES_STATE_READ_VALUE_HUFFMAN;
            nghttp3_qpack_huffman_decode_context_init(&local_60->huffman_ctx);
            uVar5 = (decoder->rstate).left * 2;
          }
          uVar4 = nghttp3_rcbuf_new(rcbuf_ptr_00,uVar5 + 1,local_48);
          if (uVar4 == 0) {
            nghttp3_buf_wrap_init(local_68,(*rcbuf_ptr_00)->base,(*rcbuf_ptr_00)->len);
            bVar2 = true;
            end = local_38;
            goto LAB_0010926d;
          }
          goto LAB_00109297;
        case NGHTTP3_QPACK_ES_STATE_READ_VALUE_HUFFMAN:
          nVar8 = qpack_read_huffman_string(local_60,local_68,src,end);
          if (nVar8 < 0) {
            n = 0xfffffe6e;
            if (nVar8 != -0x6c) {
              __assert_fail("NGHTTP3_ERR_QPACK_FATAL == nread",
                            "/workspace/llm4binary/github/license_c_cmakelists/ngtcp2[P]nghttp3/lib/nghttp3_qpack.c"
                            ,0xbe6,
                            "nghttp3_ssize nghttp3_qpack_decoder_read_encoder(nghttp3_qpack_decoder *, const uint8_t *, size_t)"
                           );
            }
          }
          else {
            src = src + nVar8;
            if (*puVar1 != 0) goto LAB_0010928d;
            *(decoder->rstate).valuebuf.last = '\0';
            sVar7 = nghttp3_buf_len(local_68);
            ((decoder->rstate).value)->len = sVar7;
            if (decoder->opcode != NGHTTP3_QPACK_ES_OPCODE_INSERT) {
              if (decoder->opcode != NGHTTP3_QPACK_ES_OPCODE_INSERT_INDEXED) {
                nghttp3_unreachable_fail
                          ("nghttp3_qpack.c",0xbfb,"nghttp3_qpack_decoder_read_encoder");
              }
              goto LAB_001090e2;
            }
LAB_001090ec:
            uVar4 = nghttp3_qpack_decoder_dtable_literal_add(decoder);
LAB_001090f4:
            n = (ulong)uVar4;
            if (uVar4 == 0) {
LAB_001090fe:
              decoder->state = NGHTTP3_QPACK_ES_STATE_OPCODE;
              *rcbuf_ptr = (nghttp3_rcbuf *)0x0;
              (decoder->rstate).value = (nghttp3_rcbuf *)0x0;
              nghttp3_buf_init(local_70);
              nghttp3_buf_init(local_68);
              *(undefined8 *)((long)&(decoder->rstate).absidx + 4) = 0;
              (decoder->rstate).dynamic = 0;
              (decoder->rstate).huffman_encoded = 0;
              (decoder->rstate).shift = 0;
              (decoder->rstate).absidx = 0;
              *puVar1 = 0;
              (decoder->rstate).prefix = 0;
              goto LAB_00109169;
            }
          }
          break;
        case NGHTTP3_QPACK_ES_STATE_READ_VALUE:
          uVar5 = (decoder->rstate).left;
          n = (long)end - (long)src;
          if (uVar5 <= (ulong)((long)end - (long)src)) {
            n = uVar5;
          }
          puVar6 = nghttp3_cpymem((decoder->rstate).valuebuf.last,src,n);
          (decoder->rstate).valuebuf.last = puVar6;
          sVar7 = (decoder->rstate).left;
          (decoder->rstate).left = sVar7 - n;
          if (-1 < (long)n) {
            src = src + n;
            if (sVar7 != n) goto LAB_0010928d;
            *puVar6 = '\0';
            sVar7 = nghttp3_buf_len(local_68);
            ((decoder->rstate).value)->len = sVar7;
            if (decoder->opcode == NGHTTP3_QPACK_ES_OPCODE_INSERT) goto LAB_001090ec;
            if (decoder->opcode != NGHTTP3_QPACK_ES_OPCODE_INSERT_INDEXED) {
              nghttp3_unreachable_fail("nghttp3_qpack.c",0xc1c,"nghttp3_qpack_decoder_read_encoder")
              ;
            }
LAB_001090e2:
            uVar4 = nghttp3_qpack_decoder_dtable_indexed_add(decoder);
            goto LAB_001090f4;
          }
          break;
        default:
switchD_00108d0f_default:
          bVar2 = false;
          goto LAB_0010926d;
        }
        (decoder->ctx).bad = '\x01';
        nVar8 = (nghttp3_ssize)(int)n;
      }
    }
  }
  return nVar8;
}

Assistant:

nghttp3_ssize nghttp3_qpack_decoder_read_encoder(nghttp3_qpack_decoder *decoder,
                                                 const uint8_t *src,
                                                 size_t srclen) {
  const uint8_t *p = src, *end;
  int rv;
  int busy = 0;
  const nghttp3_mem *mem = decoder->ctx.mem;
  nghttp3_ssize nread;
  int rfin;

  if (decoder->ctx.bad) {
    return NGHTTP3_ERR_QPACK_FATAL;
  }

  if (srclen == 0) {
    return 0;
  }

  decoder->uninterrupted_encoderlen += srclen;
  if (decoder->uninterrupted_encoderlen > NGHTTP3_QPACK_MAX_ENCODERLEN) {
    return NGHTTP3_ERR_QPACK_ENCODER_STREAM_ERROR;
  }

  end = src + srclen;

  for (; p != end || busy;) {
    busy = 0;
    switch (decoder->state) {
    case NGHTTP3_QPACK_ES_STATE_OPCODE:
      switch ((*p) & 0xe0) {
      case 0x80:
      case 0xa0:
      case 0xc0:
      case 0xe0:
        DEBUGF("qpack::decode: OPCODE_INSERT_INDEXED\n");
        decoder->opcode = NGHTTP3_QPACK_ES_OPCODE_INSERT_INDEXED;
        decoder->rstate.dynamic = !((*p) & 0x40);
        decoder->rstate.prefix = 6;
        decoder->state = NGHTTP3_QPACK_ES_STATE_READ_INDEX;

        break;
      case 0x40:
      case 0x60:
        DEBUGF("qpack::decode: OPCODE_INSERT\n");
        decoder->opcode = NGHTTP3_QPACK_ES_OPCODE_INSERT;
        decoder->rstate.dynamic = 0;
        decoder->rstate.prefix = 5;
        decoder->state = NGHTTP3_QPACK_ES_STATE_CHECK_NAME_HUFFMAN;

        break;
      case 0x20:
        DEBUGF("qpack::decode: OPCODE_SET_DTABLE_TABLE_CAP\n");
        decoder->opcode = NGHTTP3_QPACK_ES_OPCODE_SET_DTABLE_CAP;
        decoder->rstate.prefix = 5;
        decoder->state = NGHTTP3_QPACK_ES_STATE_READ_INDEX;

        break;
      default:
        DEBUGF("qpack::decode: OPCODE_DUPLICATE\n");
        decoder->opcode = NGHTTP3_QPACK_ES_OPCODE_DUPLICATE;
        decoder->rstate.dynamic = 1;
        decoder->rstate.prefix = 5;
        decoder->state = NGHTTP3_QPACK_ES_STATE_READ_INDEX;
      }
      break;
    case NGHTTP3_QPACK_ES_STATE_READ_INDEX:
      nread = qpack_read_varint(&rfin, &decoder->rstate, p, end);
      if (nread < 0) {
        assert(NGHTTP3_ERR_QPACK_FATAL == nread);
        rv = NGHTTP3_ERR_QPACK_ENCODER_STREAM_ERROR;
        goto fail;
      }

      p += nread;

      if (!rfin) {
        return p - src;
      }

      if (decoder->opcode == NGHTTP3_QPACK_ES_OPCODE_SET_DTABLE_CAP) {
        DEBUGF("qpack::decode: Set dtable capacity to %" PRIu64 "\n",
               decoder->rstate.left);
        rv = nghttp3_qpack_decoder_set_max_dtable_capacity(
          decoder, (size_t)decoder->rstate.left);
        if (rv != 0) {
          rv = NGHTTP3_ERR_QPACK_ENCODER_STREAM_ERROR;
          goto fail;
        }

        decoder->state = NGHTTP3_QPACK_ES_STATE_OPCODE;
        nghttp3_qpack_read_state_reset(&decoder->rstate);
        break;
      }

      rv = nghttp3_qpack_decoder_rel2abs(decoder, &decoder->rstate);
      if (rv < 0) {
        goto fail;
      }

      switch (decoder->opcode) {
      case NGHTTP3_QPACK_ES_OPCODE_DUPLICATE:
        rv = nghttp3_qpack_decoder_dtable_duplicate_add(decoder);
        if (rv != 0) {
          goto fail;
        }

        decoder->state = NGHTTP3_QPACK_ES_STATE_OPCODE;
        nghttp3_qpack_read_state_reset(&decoder->rstate);

        break;
      case NGHTTP3_QPACK_ES_OPCODE_INSERT_INDEXED:
        decoder->rstate.prefix = 7;
        decoder->state = NGHTTP3_QPACK_ES_STATE_CHECK_VALUE_HUFFMAN;

        break;
      default:
        nghttp3_unreachable();
      }

      break;
    case NGHTTP3_QPACK_ES_STATE_CHECK_NAME_HUFFMAN:
      qpack_read_state_check_huffman(&decoder->rstate, *p);
      decoder->state = NGHTTP3_QPACK_ES_STATE_READ_NAMELEN;
      decoder->rstate.left = 0;
      decoder->rstate.shift = 0;
      /* Fall through */
    case NGHTTP3_QPACK_ES_STATE_READ_NAMELEN:
      nread = qpack_read_varint(&rfin, &decoder->rstate, p, end);
      if (nread < 0) {
        assert(NGHTTP3_ERR_QPACK_FATAL == nread);
        rv = NGHTTP3_ERR_QPACK_ENCODER_STREAM_ERROR;
        goto fail;
      }

      p += nread;

      if (!rfin) {
        return p - src;
      }

      if (decoder->rstate.left > NGHTTP3_QPACK_MAX_NAMELEN) {
        rv = NGHTTP3_ERR_QPACK_HEADER_TOO_LARGE;
        goto fail;
      }

      if (decoder->rstate.huffman_encoded) {
        decoder->state = NGHTTP3_QPACK_ES_STATE_READ_NAME_HUFFMAN;
        nghttp3_qpack_huffman_decode_context_init(&decoder->rstate.huffman_ctx);
        rv = nghttp3_rcbuf_new(&decoder->rstate.name,
                               (size_t)decoder->rstate.left * 2 + 1, mem);
      } else {
        decoder->state = NGHTTP3_QPACK_ES_STATE_READ_NAME;
        rv = nghttp3_rcbuf_new(&decoder->rstate.name,
                               (size_t)decoder->rstate.left + 1, mem);
      }
      if (rv != 0) {
        goto fail;
      }

      nghttp3_buf_wrap_init(&decoder->rstate.namebuf,
                            decoder->rstate.name->base,
                            decoder->rstate.name->len);
      break;
    case NGHTTP3_QPACK_ES_STATE_READ_NAME_HUFFMAN:
      nread = qpack_read_huffman_string(&decoder->rstate,
                                        &decoder->rstate.namebuf, p, end);
      if (nread < 0) {
        assert(NGHTTP3_ERR_QPACK_FATAL == nread);
        rv = NGHTTP3_ERR_QPACK_ENCODER_STREAM_ERROR;
        goto fail;
      }

      p += nread;

      if (decoder->rstate.left) {
        return p - src;
      }

      qpack_read_state_terminate_name(&decoder->rstate);

      decoder->state = NGHTTP3_QPACK_ES_STATE_CHECK_VALUE_HUFFMAN;
      decoder->rstate.prefix = 7;
      break;
    case NGHTTP3_QPACK_ES_STATE_READ_NAME:
      nread =
        qpack_read_string(&decoder->rstate, &decoder->rstate.namebuf, p, end);
      if (nread < 0) {
        rv = (int)nread;
        goto fail;
      }

      p += nread;

      if (decoder->rstate.left) {
        return p - src;
      }

      qpack_read_state_terminate_name(&decoder->rstate);

      decoder->state = NGHTTP3_QPACK_ES_STATE_CHECK_VALUE_HUFFMAN;
      decoder->rstate.prefix = 7;
      break;
    case NGHTTP3_QPACK_ES_STATE_CHECK_VALUE_HUFFMAN:
      qpack_read_state_check_huffman(&decoder->rstate, *p);
      decoder->state = NGHTTP3_QPACK_ES_STATE_READ_VALUELEN;
      decoder->rstate.left = 0;
      decoder->rstate.shift = 0;
      /* Fall through */
    case NGHTTP3_QPACK_ES_STATE_READ_VALUELEN:
      nread = qpack_read_varint(&rfin, &decoder->rstate, p, end);
      if (nread < 0) {
        assert(NGHTTP3_ERR_QPACK_FATAL == nread);
        rv = NGHTTP3_ERR_QPACK_ENCODER_STREAM_ERROR;
        goto fail;
      }

      p += nread;

      if (!rfin) {
        return p - src;
      }

      if (decoder->rstate.left > NGHTTP3_QPACK_MAX_VALUELEN) {
        rv = NGHTTP3_ERR_QPACK_HEADER_TOO_LARGE;
        goto fail;
      }

      if (decoder->rstate.huffman_encoded) {
        decoder->state = NGHTTP3_QPACK_ES_STATE_READ_VALUE_HUFFMAN;
        nghttp3_qpack_huffman_decode_context_init(&decoder->rstate.huffman_ctx);
        rv = nghttp3_rcbuf_new(&decoder->rstate.value,
                               (size_t)decoder->rstate.left * 2 + 1, mem);
      } else {
        decoder->state = NGHTTP3_QPACK_ES_STATE_READ_VALUE;
        rv = nghttp3_rcbuf_new(&decoder->rstate.value,
                               (size_t)decoder->rstate.left + 1, mem);
      }
      if (rv != 0) {
        goto fail;
      }

      nghttp3_buf_wrap_init(&decoder->rstate.valuebuf,
                            decoder->rstate.value->base,
                            decoder->rstate.value->len);

      /* value might be 0 length */
      busy = 1;
      break;
    case NGHTTP3_QPACK_ES_STATE_READ_VALUE_HUFFMAN:
      nread = qpack_read_huffman_string(&decoder->rstate,
                                        &decoder->rstate.valuebuf, p, end);
      if (nread < 0) {
        assert(NGHTTP3_ERR_QPACK_FATAL == nread);
        rv = NGHTTP3_ERR_QPACK_ENCODER_STREAM_ERROR;
        goto fail;
      }

      p += nread;

      if (decoder->rstate.left) {
        return p - src;
      }

      qpack_read_state_terminate_value(&decoder->rstate);

      switch (decoder->opcode) {
      case NGHTTP3_QPACK_ES_OPCODE_INSERT_INDEXED:
        rv = nghttp3_qpack_decoder_dtable_indexed_add(decoder);
        break;
      case NGHTTP3_QPACK_ES_OPCODE_INSERT:
        rv = nghttp3_qpack_decoder_dtable_literal_add(decoder);
        break;
      default:
        nghttp3_unreachable();
      }
      if (rv != 0) {
        goto fail;
      }

      decoder->state = NGHTTP3_QPACK_ES_STATE_OPCODE;
      nghttp3_qpack_read_state_reset(&decoder->rstate);
      break;
    case NGHTTP3_QPACK_ES_STATE_READ_VALUE:
      nread =
        qpack_read_string(&decoder->rstate, &decoder->rstate.valuebuf, p, end);
      if (nread < 0) {
        rv = (int)nread;
        goto fail;
      }

      p += nread;

      if (decoder->rstate.left) {
        return p - src;
      }

      qpack_read_state_terminate_value(&decoder->rstate);

      switch (decoder->opcode) {
      case NGHTTP3_QPACK_ES_OPCODE_INSERT_INDEXED:
        rv = nghttp3_qpack_decoder_dtable_indexed_add(decoder);
        break;
      case NGHTTP3_QPACK_ES_OPCODE_INSERT:
        rv = nghttp3_qpack_decoder_dtable_literal_add(decoder);
        break;
      default:
        nghttp3_unreachable();
      }
      if (rv != 0) {
        goto fail;
      }

      decoder->state = NGHTTP3_QPACK_ES_STATE_OPCODE;
      nghttp3_qpack_read_state_reset(&decoder->rstate);
      break;
    }
  }

  return p - src;

fail:
  decoder->ctx.bad = 1;
  return rv;
}